

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

locateresult __thiscall
tetgenmesh::slocate(tetgenmesh *this,point searchpt,face *searchsh,int aflag,int cflag,int rflag)

{
  int *piVar1;
  shellface *pppdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  locateresult lVar5;
  int *piVar6;
  shellface *pppdVar7;
  long lVar8;
  ulong uVar9;
  shellface ppdVar10;
  uint uVar11;
  int iVar12;
  shellface ppdVar13;
  shellface ppdVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double n [3];
  
  pppdVar2 = searchsh->sh;
  iVar12 = searchsh->shver;
  ppdVar10 = pppdVar2[sorgpivot[iVar12]];
  ppdVar14 = pppdVar2[sdestpivot[iVar12]];
  ppdVar13 = pppdVar2[sapexpivot[iVar12]];
  if (aflag == 0) {
    calculateabovepoint4(this,(point)ppdVar10,(point)ppdVar14,(point)ppdVar13,searchpt);
  }
  piVar1 = &searchsh->shver;
  dVar16 = orient3d((double *)ppdVar10,(double *)ppdVar14,(double *)ppdVar13,this->dummypoint);
  if (dVar16 <= 0.0) {
    if ((dVar16 == 0.0) && (!NAN(dVar16))) {
      return UNKNOWN;
    }
  }
  else {
    *(byte *)piVar1 = (byte)*piVar1 ^ 1;
  }
  iVar12 = 3;
  while( true ) {
    bVar15 = iVar12 == 0;
    iVar12 = iVar12 + -1;
    if (bVar15) {
      return UNKNOWN;
    }
    ppdVar10 = searchsh->sh[sorgpivot[searchsh->shver]];
    ppdVar14 = searchsh->sh[sdestpivot[searchsh->shver]];
    dVar16 = orient3d((double *)ppdVar10,(double *)ppdVar14,this->dummypoint,searchpt);
    if (0.0 < dVar16) break;
    *piVar1 = snextpivot[*piVar1];
  }
  ppdVar13 = searchsh->sh[sapexpivot[searchsh->shver]];
  if (ppdVar13 == (shellface)searchpt) {
    lVar8 = (long)snextpivot[searchsh->shver];
  }
  else {
    do {
      dVar16 = orient3d((double *)ppdVar14,(double *)ppdVar13,this->dummypoint,searchpt);
      dVar17 = orient3d((double *)ppdVar13,(double *)ppdVar10,this->dummypoint,searchpt);
      if (0.0 <= dVar16) {
        if (dVar17 < 0.0) goto LAB_00121f2b;
        if (dVar16 <= 0.0) {
          iVar12 = snextpivot[*piVar1];
          if (dVar17 <= 0.0) {
            iVar12 = snextpivot[iVar12];
            goto LAB_00121fdb;
          }
LAB_0012202b:
          lVar5 = ONEDGE;
          *piVar1 = iVar12;
          bVar15 = false;
        }
        else {
          if (dVar17 <= 0.0) {
            iVar12 = snextpivot[snextpivot[*piVar1]];
            goto LAB_0012202b;
          }
          lVar5 = ONFACE;
          bVar15 = true;
        }
        if (rflag == 0) {
          return lVar5;
        }
        pppdVar2 = searchsh->sh;
        iVar12 = searchsh->shver;
        ppdVar10 = pppdVar2[sorgpivot[iVar12]];
        ppdVar14 = pppdVar2[sdestpivot[iVar12]];
        ppdVar13 = pppdVar2[sapexpivot[iVar12]];
        facenormal(this,(point)ppdVar10,(point)ppdVar14,(point)ppdVar13,n,1,(double *)0x0);
        dVar18 = SQRT(n[2] * n[2] + n[0] * n[0] + n[1] * n[1]);
        facenormal(this,(point)ppdVar14,(point)ppdVar13,searchpt,n,1,(double *)0x0);
        dVar4 = n[2];
        dVar19 = n[1];
        dVar17 = n[0];
        dVar16 = this->b->epsilon;
        facenormal(this,(point)ppdVar13,(point)ppdVar10,searchpt,n,1,(double *)0x0);
        auVar20._0_8_ = n[0] * n[0] + n[1] * n[1];
        auVar20._8_8_ = dVar17 * dVar17 + dVar19 * dVar19;
        auVar21._8_8_ = dVar4 * dVar4 + auVar20._8_8_;
        auVar21._0_8_ = n[2] * n[2] + auVar20._0_8_;
        auVar21 = sqrtpd(auVar20,auVar21);
        auVar22._8_8_ = dVar18;
        auVar22._0_8_ = dVar18;
        auVar22 = divpd(auVar21,auVar22);
        dVar17 = (double)(-(ulong)(this->b->epsilon <= auVar22._0_8_) & auVar21._0_8_);
        dVar16 = (double)(-(ulong)(dVar16 <= auVar22._8_8_) & auVar21._8_8_);
        if (bVar15) {
          facenormal(this,(point)ppdVar10,(point)ppdVar14,searchpt,n,1,(double *)0x0);
          dVar19 = SQRT(n[2] * n[2] + n[0] * n[0] + n[1] * n[1]);
          if (((dVar19 != 0.0) || (NAN(dVar19))) && (this->b->epsilon <= dVar19 / dVar18)) {
            if (dVar16 == 0.0) {
              iVar12 = snextpivot[*piVar1];
              if ((dVar17 == 0.0) && (!NAN(dVar17))) {
                lVar8 = (long)iVar12;
                goto LAB_00121fd7;
              }
            }
            else {
              if ((dVar17 != 0.0) || (NAN(dVar17))) {
                return ONFACE;
              }
              iVar12 = snextpivot[snextpivot[*piVar1]];
            }
            *piVar1 = iVar12;
            return ONEDGE;
          }
        }
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          return (dVar17 == 0.0) + ONEDGE;
        }
        lVar8 = (long)*piVar1;
        goto LAB_00121fd7;
      }
      piVar6 = piVar1;
      if ((dVar17 < 0.0) &&
         (auVar3._8_8_ = 0, auVar3._0_8_ = this->randomseed * 0x556 + 0x24d69,
         this->randomseed = SUB168(auVar3 % ZEXT816(0xae529),0),
         (auVar3 % ZEXT816(0xae529) & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
LAB_00121f2b:
        piVar6 = snextpivot + *piVar1;
      }
      iVar12 = snextpivot[*piVar6];
      searchsh->shver = iVar12;
      pppdVar2 = searchsh->sh;
      if ((cflag == 0) && (pppdVar2[(long)(iVar12 >> 1) + 6] != (shellface)0x0)) {
        return ENCSEGMENT;
      }
      pppdVar7 = (shellface *)((ulong)pppdVar2[iVar12 >> 1] & 0xfffffffffffffff8);
      if (pppdVar7 == (shellface *)0x0) {
        return OUTSIDE;
      }
      uVar11 = (uint)pppdVar2[iVar12 >> 1] & 7;
      uVar11 = pppdVar7[sorgpivot[uVar11]] != pppdVar2[sdestpivot[iVar12]] ^ uVar11;
      searchsh->sh = pppdVar7;
      searchsh->shver = uVar11;
      uVar9 = (ulong)(uVar11 * 4);
      ppdVar10 = pppdVar7[*(int *)((long)sorgpivot + uVar9)];
      ppdVar14 = pppdVar7[*(int *)((long)sdestpivot + uVar9)];
      ppdVar13 = pppdVar7[*(int *)((long)sapexpivot + uVar9)];
    } while (ppdVar13 != (shellface)searchpt);
    lVar8 = (long)snextpivot[uVar11];
  }
LAB_00121fd7:
  iVar12 = snextpivot[lVar8];
LAB_00121fdb:
  *piVar1 = iVar12;
  return ONVERTEX;
}

Assistant:

enum tetgenmesh::locateresult tetgenmesh::slocate(point searchpt, 
  face* searchsh, int aflag, int cflag, int rflag)
{
  face neighsh;
  point pa, pb, pc;
  enum locateresult loc;
  enum {MOVE_BC, MOVE_CA} nextmove;
  REAL ori, ori_bc, ori_ca;
  int i;

  pa = sorg(*searchsh);
  pb = sdest(*searchsh);
  pc = sapex(*searchsh);

  if (!aflag) {
    // No above point is given. Calculate an above point for this facet.
    calculateabovepoint4(pa, pb, pc, searchpt);
  }

  // 'dummypoint' is given. Make sure it is above [a,b,c]
  ori = orient3d(pa, pb, pc, dummypoint);
  if (ori > 0) {
    sesymself(*searchsh); // Reverse the face orientation.
  } else if (ori == 0.0) {
    // This case should not happen theoretically. But... 
    return UNKNOWN; 
  }

  // Find an edge of the face s.t. p lies on its right-hand side (CCW).
  for (i = 0; i < 3; i++) {
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    ori = orient3d(pa, pb, dummypoint, searchpt);
    if (ori > 0) break;
    senextself(*searchsh);
  }
  if (i == 3) {
    return UNKNOWN;
  }

  pc = sapex(*searchsh);

  if (pc == searchpt) {
    senext2self(*searchsh);
    return ONVERTEX;
  }

  while (1) {

    ori_bc = orient3d(pb, pc, dummypoint, searchpt);
    ori_ca = orient3d(pc, pa, dummypoint, searchpt);

    if (ori_bc < 0) {
      if (ori_ca < 0) { // (--)
        // Any of the edges is a viable move.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_BC;
        }
      } else { // (-#)
        // Edge [b, c] is viable.
        nextmove = MOVE_BC;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        // Edge [c, a] is viable.
        nextmove = MOVE_CA;
      } else {
        if (ori_bc > 0) {
          if (ori_ca > 0) { // (++)
            loc = ONFACE;  // Inside [a, b, c].
            break;
          } else { // (+0)
            senext2self(*searchsh); // On edge [c, a].
            loc = ONEDGE;
            break;
          }
        } else { // ori_bc == 0
          if (ori_ca > 0) { // (0+)
            senextself(*searchsh); // On edge [b, c].
            loc = ONEDGE;
            break;
          } else { // (00)
            // p is coincident with vertex c. 
            senext2self(*searchsh);
            return ONVERTEX;
          }
        }
      }
    }

    // Move to the next face.
    if (nextmove == MOVE_BC) {
      senextself(*searchsh);
    } else {
      senext2self(*searchsh);
    }
    if (!cflag) {
      // NON-convex case. Check if we will cross a boundary.
      if (isshsubseg(*searchsh)) {
        return ENCSEGMENT;
      }
    }
    spivot(*searchsh, neighsh);
    if (neighsh.sh == NULL) {
      return OUTSIDE; // A hull edge.
    }
    // Adjust the edge orientation.
    if (sorg(neighsh) != sdest(*searchsh)) {
      sesymself(neighsh);
    }

    // Update the newly discovered face and its endpoints.
    *searchsh = neighsh;
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    if (pc == searchpt) {
      senext2self(*searchsh);
      return ONVERTEX;
    }

  } // while (1)

  // assert(loc == ONFACE || loc == ONEDGE);


  if (rflag) {
    // Round the locate result before return.
    REAL n[3], area_abc, area_abp, area_bcp, area_cap;

    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    facenormal(pa, pb, pc, n, 1, NULL);
    area_abc = sqrt(dot(n, n));

    facenormal(pb, pc, searchpt, n, 1, NULL);
    area_bcp = sqrt(dot(n, n));
    if ((area_bcp / area_abc) < b->epsilon) {
      area_bcp = 0; // Rounding.
    }

    facenormal(pc, pa, searchpt, n, 1, NULL);
    area_cap = sqrt(dot(n, n));
    if ((area_cap / area_abc) < b->epsilon) {
      area_cap = 0; // Rounding
    }

    if ((loc == ONFACE) || (loc == OUTSIDE)) {
      facenormal(pa, pb, searchpt, n, 1, NULL);
      area_abp = sqrt(dot(n, n));
      if ((area_abp / area_abc) < b->epsilon) {
        area_abp = 0; // Rounding
      }
    } else { // loc == ONEDGE
      area_abp = 0;
    }

    if (area_abp == 0) {
      if (area_bcp == 0) {
        senextself(*searchsh); 
        loc = ONVERTEX; // p is close to b.
      } else {
        if (area_cap == 0) {
          loc = ONVERTEX; // p is close to a.
        } else {
          loc = ONEDGE; // p is on edge [a,b].
        }
      }
    } else if (area_bcp == 0) {
      if (area_cap == 0) {
        senext2self(*searchsh); 
        loc = ONVERTEX; // p is close to c.
      } else {
        senextself(*searchsh);
        loc = ONEDGE; // p is on edge [b,c].
      }
    } else if (area_cap == 0) {
      senext2self(*searchsh);
      loc = ONEDGE; // p is on edge [c,a].
    } else {
      loc = ONFACE; // p is on face [a,b,c].
    }
  } // if (rflag)

  return loc;
}